

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O2

bool __thiscall
glcts::ShaderBitfieldOperationCaseUnpackUnorm::test
          (ShaderBitfieldOperationCaseUnpackUnorm *this,Data *data)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  
  uVar2 = data->inUvec4[0];
  fVar3 = (float)(uVar2 & 0xff) / -255.0 + data->outVec4[0];
  uVar1 = -(uint)(-fVar3 <= fVar3);
  if ((((float)(~uVar1 & (uint)-fVar3 | (uint)fVar3 & uVar1) <= 0.0001) &&
      (fVar3 = (float)(uVar2 >> 8 & 0xff) / -255.0 + data->outVec4[1],
      uVar1 = -(uint)(-fVar3 <= fVar3),
      (float)(~uVar1 & (uint)-fVar3 | (uint)fVar3 & uVar1) <= 0.0001)) &&
     (fVar3 = (float)(uVar2 >> 0x10 & 0xff) / -255.0 + data->outVec4[2],
     uVar1 = -(uint)(-fVar3 <= fVar3),
     (float)(~uVar1 & (uint)-fVar3 | (uint)fVar3 & uVar1) <= 0.0001)) {
    fVar3 = (float)(uVar2 >> 0x18) / -255.0 + data->outVec4[3];
    uVar2 = -(uint)(-fVar3 <= fVar3);
    return (float)(~uVar2 & (uint)-fVar3 | (uint)fVar3 & uVar2) <= 0.0001;
  }
  return false;
}

Assistant:

virtual bool test(Data const* data)
	{
		GLfloat x = float((data->inUvec4[0] >> 0) & 0xFF) / 255.0f;
		if (deFloatAbs(data->outVec4[0] - x) > 0.0001f)
		{
			return false;
		}
		GLfloat y = float((data->inUvec4[0] >> 8) & 0xFF) / 255.0f;
		if (deFloatAbs(data->outVec4[1] - y) > 0.0001f)
		{
			return false;
		}
		GLfloat z = float((data->inUvec4[0] >> 16) & 0xFF) / 255.0f;
		if (deFloatAbs(data->outVec4[2] - z) > 0.0001f)
		{
			return false;
		}
		GLfloat w = float((data->inUvec4[0] >> 24) & 0xFF) / 255.0f;
		if (deFloatAbs(data->outVec4[3] - w) > 0.0001f)
		{
			return false;
		}

		return true;
	}